

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O1

int cram_byte_array_len_encode_store(cram_codec *c,cram_block *b,char *prefix,int version)

{
  cram_codec *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uchar *puVar6;
  cram_block *b_00;
  cram_block *b_01;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  size_t local_38;
  
  if (prefix == (char *)0x0) {
    local_38 = 0;
  }
  else {
    local_38 = strlen(prefix);
    uVar7 = b->alloc;
    sVar9 = b->byte;
    if (uVar7 <= sVar9 + local_38) {
      do {
        auVar12._8_4_ = (int)(uVar7 >> 0x20);
        auVar12._0_8_ = uVar7;
        auVar12._12_4_ = 0x45300000;
        dVar15 = ((auVar12._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)) * 1.5;
        uVar8 = (ulong)dVar15;
        sVar10 = (long)(dVar15 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8;
        if (uVar7 == 0) {
          sVar10 = 0x400;
        }
        b->alloc = sVar10;
        puVar6 = (uchar *)realloc(b->data,sVar10);
        b->data = puVar6;
        uVar7 = b->alloc;
        sVar9 = b->byte;
      } while (uVar7 <= sVar9 + local_38);
    }
    memcpy(b->data + sVar9,prefix,local_38);
    b->byte = b->byte + local_38;
  }
  pcVar1 = (c->field_6).e_byte_array_len.len_codec;
  b_00 = cram_new_block(FILE_HEADER,0);
  iVar2 = (*pcVar1->store)(pcVar1,b_00,(char *)0x0,version);
  pcVar1 = (c->field_6).e_byte_array_len.val_codec;
  b_01 = cram_new_block(FILE_HEADER,0);
  iVar3 = (*pcVar1->store)(pcVar1,b_01,(char *)0x0,version);
  iVar4 = itf8_put_blk(b,c->codec);
  iVar5 = itf8_put_blk(b,iVar3 + iVar2);
  uVar7 = b->alloc;
  sVar9 = b->byte;
  sVar11 = b_00->byte;
  if (uVar7 <= sVar11 + sVar9) {
    do {
      auVar13._8_4_ = (int)(uVar7 >> 0x20);
      auVar13._0_8_ = uVar7;
      auVar13._12_4_ = 0x45300000;
      dVar15 = ((auVar13._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)) * 1.5;
      uVar8 = (ulong)dVar15;
      sVar10 = (long)(dVar15 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8;
      if (uVar7 == 0) {
        sVar10 = 0x400;
      }
      b->alloc = sVar10;
      puVar6 = (uchar *)realloc(b->data,sVar10);
      b->data = puVar6;
      uVar7 = b->alloc;
      sVar9 = b->byte;
      sVar11 = b_00->byte;
    } while (uVar7 <= sVar11 + sVar9);
  }
  memcpy(b->data + sVar9,b_00->data,sVar11);
  uVar7 = b->alloc;
  sVar11 = b->byte + b_00->byte;
  b->byte = sVar11;
  sVar9 = b_01->byte;
  if (uVar7 <= sVar9 + sVar11) {
    do {
      auVar14._8_4_ = (int)(uVar7 >> 0x20);
      auVar14._0_8_ = uVar7;
      auVar14._12_4_ = 0x45300000;
      dVar15 = ((auVar14._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)) * 1.5;
      uVar8 = (ulong)dVar15;
      sVar10 = (long)(dVar15 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8;
      if (uVar7 == 0) {
        sVar10 = 0x400;
      }
      b->alloc = sVar10;
      puVar6 = (uchar *)realloc(b->data,sVar10);
      b->data = puVar6;
      uVar7 = b->alloc;
      sVar11 = b->byte;
      sVar9 = b_01->byte;
    } while (uVar7 <= sVar9 + sVar11);
  }
  memcpy(b->data + sVar11,b_01->data,sVar9);
  b->byte = b->byte + b_01->byte;
  cram_free_block(b_00);
  cram_free_block(b_01);
  return iVar3 + iVar2 + (int)local_38 + iVar4 + iVar5;
}

Assistant:

int cram_byte_array_len_encode_store(cram_codec *c, cram_block *b,
				     char *prefix, int version) {
    int len = 0, len2, len3;
    cram_codec *tc;
    cram_block *b_len, *b_val;

    if (prefix) {
	size_t l = strlen(prefix);
	BLOCK_APPEND(b, prefix, l);
	len += l;
    }

    tc = c->e_byte_array_len.len_codec; 
    b_len = cram_new_block(0, 0);
    len2 = tc->store(tc, b_len, NULL, version);

    tc = c->e_byte_array_len.val_codec;
    b_val = cram_new_block(0, 0);
    len3 = tc->store(tc, b_val, NULL, version);

    len += itf8_put_blk(b, c->codec);
    len += itf8_put_blk(b, len2+len3);
    BLOCK_APPEND(b, BLOCK_DATA(b_len), BLOCK_SIZE(b_len));
    BLOCK_APPEND(b, BLOCK_DATA(b_val), BLOCK_SIZE(b_val));

    cram_free_block(b_len);
    cram_free_block(b_val);

    return len + len2 + len3;
}